

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjasm.cpp
# Opt level: O0

void Options::COptionsParser::splitByChar
               (char *s,int splitter,char *v1,size_t v1Size,char *v2,size_t v2Size)

{
  char *local_48;
  char *spos;
  size_t v2Size_local;
  char *v2_local;
  size_t v1Size_local;
  char *v1_local;
  int splitter_local;
  char *s_local;
  
  if (splitter == 0) {
    local_48 = (char *)0x0;
  }
  else {
    local_48 = strchr(s,splitter);
  }
  if (local_48 == (char *)0x0) {
    strcpy(v1,s);
    *v2 = '\0';
  }
  else {
    strncpy(v1,s,(long)local_48 - (long)s);
    v1[(long)local_48 - (long)s] = '\0';
    strcpy(v2,local_48 + 1);
  }
  return;
}

Assistant:

static void splitByChar(const char* s, const int splitter,
							   char* v1, const size_t v1Size,
							   char* v2, const size_t v2Size) {
			// only non-zero splitter character is supported
			const char* spos = splitter ? STRCHR(s, splitter) : NULL;
			if (NULL == spos) {
				// splitter character not found, copy whole input string into v1, v2 = empty string
				STRCPY(v1, v1Size, s);
				v2[0] = 0;
			} else {
				// splitter found, copy string ahead splitter to v1, after it to v2
				STRNCPY(v1, v1Size, s, spos - s);
				v1[spos - s] = 0;
				STRCPY(v2, v2Size, spos + 1);
			}
		}